

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O1

void __thiscall SoftwareVersionTlv::SoftwareVersionTlv(SoftwareVersionTlv *this,istream *is)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t arr [4];
  string __str_1;
  string __str;
  byte local_d4;
  byte local_d3;
  byte local_d2;
  byte local_d1;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  char *local_70 [2];
  char local_60 [16];
  string *local_50;
  string *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  Tlv::Tlv(&this->super_Tlv,is);
  (this->super_Tlv)._vptr_Tlv = (_func_int **)&PTR__SoftwareVersionTlv_001201b0;
  local_48 = (string *)&this->release_version;
  local_38 = &(this->release_version).field_2;
  (this->release_version)._M_dataplus._M_p = (pointer)local_38;
  (this->release_version)._M_string_length = 0;
  (this->release_version).field_2._M_local_buf[0] = '\0';
  local_50 = (string *)&this->tlv_version;
  local_40 = &(this->tlv_version).field_2;
  (this->tlv_version)._M_dataplus._M_p = (pointer)local_40;
  (this->tlv_version)._M_string_length = 0;
  (this->tlv_version).field_2._M_local_buf[0] = '\0';
  std::istream::read((char *)is,(long)&local_d4);
  uVar6 = 1;
  if (9 < local_d4) {
    uVar6 = 3 - (local_d4 < 100);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0],uVar6,(uint)local_d4);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_c0 = *puVar4;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar4;
    local_d0 = (ulong *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  uVar6 = 1;
  if (9 < local_d3) {
    uVar6 = 3 - (local_d3 < 100);
  }
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,uVar6,(uint)local_d3);
  uVar5 = 0xf;
  if (local_d0 != &local_c0) {
    uVar5 = local_c0;
  }
  if (uVar5 < (ulong)(local_a8 + local_c8)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_c8)) goto LAB_00112115;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_00112115:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
  }
  local_90 = &local_80;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar3[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar3;
  }
  local_88 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=(local_48,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  uVar6 = 1;
  if (9 < local_d2) {
    uVar6 = 3 - (local_d2 < 100);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0],uVar6,(uint)local_d2);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_c0 = *puVar4;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar4;
    local_d0 = (ulong *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  uVar6 = 1;
  if (9 < local_d1) {
    uVar6 = 3 - (local_d1 < 100);
  }
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,uVar6,(uint)local_d1);
  uVar5 = 0xf;
  if (local_d0 != &local_c0) {
    uVar5 = local_c0;
  }
  if (uVar5 < (ulong)(local_a8 + local_c8)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00112313;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_00112313:
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar3;
  }
  local_88 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=(local_50,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

SoftwareVersionTlv::SoftwareVersionTlv(std::istream& is) : Tlv(is)
{
    uint8_t arr[4];
    is.read((char*)&arr, 4);
    release_version = std::to_string(arr[0]) + "." + std::to_string(arr[1]);
    tlv_version     = std::to_string(arr[2]) + "." + std::to_string(arr[3]);
}